

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random_generators.cpp
# Opt level: O1

Vector3d *
opengv::generateRandomPoint
          (Vector3d *__return_storage_ptr__,double maximumDepth,double minimumDepth)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  uint uVar5;
  int iVar6;
  ActualDstType actualDst;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  
  uVar5 = rand();
  iVar6 = rand();
  auVar8 = vpinsrd_avx(ZEXT416(uVar5),iVar6,1);
  auVar8 = vcvtdq2pd_avx(auVar8);
  auVar7._8_8_ = 0x41dfffffffc00000;
  auVar7._0_8_ = 0x41dfffffffc00000;
  auVar7 = vdivpd_avx512vl(auVar8,auVar7);
  auVar8._8_8_ = 0xbfe0000000000000;
  auVar8._0_8_ = 0xbfe0000000000000;
  auVar8 = vaddpd_avx512vl(auVar7,auVar8);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
  m_data.array[0] = auVar8._0_8_ + auVar8._0_8_;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
  m_data.array[1] = auVar8._8_8_ + auVar8._8_8_;
  iVar6 = rand();
  dVar1 = (double)iVar6 / 2147483647.0 + -0.5;
  dVar1 = dVar1 + dVar1;
  auVar8 = *(undefined1 (*) [16])
            (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
            m_storage.m_data.array;
  dVar2 = auVar8._0_8_;
  dVar3 = auVar8._8_8_;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = dVar1 * dVar1 + dVar2 * dVar2 + dVar3 * dVar3;
  auVar7 = vsqrtpd_avx(auVar10);
  dVar9 = auVar7._0_8_;
  auVar11._8_8_ = dVar9;
  auVar11._0_8_ = dVar9;
  auVar8 = vdivpd_avx(auVar8,auVar11);
  dVar4 = maximumDepth - minimumDepth;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
  m_data.array[0] = dVar4 * dVar2 + minimumDepth * auVar8._0_8_;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
  m_data.array[1] = dVar4 * dVar3 + minimumDepth * auVar8._8_8_;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
  m_data.array[2] = dVar4 * dVar1 + (dVar1 / dVar9) * minimumDepth;
  return __return_storage_ptr__;
}

Assistant:

Eigen::Vector3d
opengv::generateRandomPoint( double maximumDepth, double minimumDepth )
{
  Eigen::Vector3d cleanPoint;
  cleanPoint[0] = (((double) rand())/ ((double) RAND_MAX)-0.5)*2.0;
  cleanPoint[1] = (((double) rand())/ ((double) RAND_MAX)-0.5)*2.0;
  cleanPoint[2] = (((double) rand())/ ((double) RAND_MAX)-0.5)*2.0;
  Eigen::Vector3d direction = cleanPoint / cleanPoint.norm();
  cleanPoint =
      (maximumDepth-minimumDepth) * cleanPoint + minimumDepth * direction;
  return cleanPoint;
}